

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-util.c++
# Opt level: O0

void capnp::_::anon_unknown_134::dynamicCheckListDefaults<capnp::DynamicStruct::Builder>
               (Builder reader)

{
  StringPtr name;
  StringPtr name_00;
  bool bVar1;
  BuilderFor<bool> BVar2;
  initializer_list<int> expected;
  initializer_list<int> expected_00;
  initializer_list<int> expected_01;
  initializer_list<capnp::Text::Reader> expected_02;
  initializer_list<capnp::Text::Reader> expected_03;
  initializer_list<capnp::Text::Reader> expected_04;
  Builder local_3ac0;
  BuilderFor<capnproto_test::capnp::test::TestAllTypes> local_3a80;
  int32_t local_3a54;
  int local_3a50;
  bool local_3a49;
  undefined1 local_3a48 [7];
  bool _kj_shouldLog_18;
  BuilderFor<capnproto_test::capnp::test::TestAllTypes> local_3a08;
  int32_t local_39dc;
  int local_39d8;
  DebugExpression<int> local_39d4;
  undefined1 local_39d0 [8];
  DebugComparison<int,_int> _kjCondition_30;
  Fault local_39a8;
  Fault f_11;
  uint local_3998;
  DebugExpression<unsigned_int> local_3994;
  undefined1 local_3990 [8];
  DebugComparison<unsigned_int,_unsigned_int> _kjCondition_29;
  BuilderFor<capnp::DynamicList> local_3930;
  Builder local_38f8;
  BuilderFor<capnproto_test::capnp::test::TestAllTypes> local_38b8;
  int32_t local_388c;
  int local_3888;
  bool local_3881;
  undefined1 local_3880 [7];
  bool _kj_shouldLog_17;
  BuilderFor<capnproto_test::capnp::test::TestAllTypes> local_3840;
  int32_t local_3814;
  int local_3810;
  DebugExpression<int> local_380c;
  undefined1 local_3808 [8];
  DebugComparison<int,_int> _kjCondition_28;
  BuilderFor<capnproto_test::capnp::test::TestAllTypes> local_37a8;
  int32_t local_377c;
  int local_3778;
  bool local_3771;
  undefined1 local_3770 [7];
  bool _kj_shouldLog_16;
  BuilderFor<capnproto_test::capnp::test::TestAllTypes> local_3730;
  int32_t local_3704;
  int local_3700;
  DebugExpression<int> local_36fc;
  undefined1 local_36f8 [8];
  DebugComparison<int,_int> _kjCondition_27;
  Fault local_36d0;
  Fault f_10;
  uint local_36c0;
  DebugExpression<unsigned_int> local_36bc;
  undefined1 local_36b8 [8];
  DebugComparison<unsigned_int,_unsigned_int> _kjCondition_26;
  undefined1 local_3658 [8];
  BuilderFor<capnp::DynamicList> e;
  Fault local_3618;
  Fault f_9;
  uint local_3608;
  DebugExpression<unsigned_int> local_3604;
  undefined1 local_3600 [8];
  DebugComparison<unsigned_int,_unsigned_int> _kjCondition_25;
  Builder local_35d0;
  undefined1 local_3590 [8];
  BuilderFor<capnp::DynamicList> l_2;
  Reader local_3548;
  StructDataBitCount *local_3538;
  undefined8 local_3530;
  Builder local_3528;
  undefined1 local_34e8 [32];
  Builder local_34c8;
  undefined1 local_3488 [48];
  Builder local_3458;
  uint local_3418;
  uint local_3414;
  Fault local_3410;
  Fault f_8;
  uint local_3400;
  DebugExpression<unsigned_int> local_33fc;
  undefined1 local_33f8 [8];
  DebugComparison<unsigned_int,_unsigned_int> _kjCondition_24;
  size_t local_33d0;
  Builder local_33c8;
  undefined1 local_3388 [8];
  BuilderFor<capnp::DynamicList> l_1;
  Builder local_3338;
  undefined1 local_32f8 [92];
  undefined1 local_329c [92];
  uint local_3240;
  uint local_323c;
  Fault local_3238;
  Fault f_7;
  uint local_3228;
  DebugExpression<unsigned_int> local_3224;
  undefined1 local_3220 [8];
  DebugComparison<unsigned_int,_unsigned_int> _kjCondition_23;
  size_t local_31f8;
  Builder local_31f0;
  undefined1 local_31b0 [8];
  BuilderFor<capnp::DynamicList> l;
  ArrayPtr<const_char> local_3168;
  Builder local_3158;
  BuilderFor<capnp::DynamicList> local_3118;
  Builder local_30e0;
  BuilderFor<capnp::DynamicStruct> local_30a0;
  Builder local_3070;
  BuilderFor<capnp::Text> local_3030;
  bool local_3011;
  undefined1 auStack_3010 [7];
  bool _kj_shouldLog_15;
  ArrayPtr<const_char> local_3000;
  Builder local_2ff0;
  BuilderFor<capnp::DynamicList> local_2fb0;
  Builder local_2f78;
  BuilderFor<capnp::DynamicStruct> local_2f38;
  Builder local_2f08;
  BuilderFor<capnp::Text> local_2ec8;
  char (*local_2eb0) [4];
  undefined1 local_2ea8 [8];
  DebugComparison<const_char_(&)[4],_capnp::Text::Builder> _kjCondition_22;
  ArrayPtr<const_char> local_2e60;
  Builder local_2e50;
  BuilderFor<capnp::DynamicList> local_2e10;
  Builder local_2dd8;
  BuilderFor<capnp::DynamicStruct> local_2d98;
  Builder local_2d68;
  BuilderFor<capnp::Text> local_2d28;
  bool local_2d09;
  undefined1 auStack_2d08 [7];
  bool _kj_shouldLog_14;
  ArrayPtr<const_char> local_2cf8;
  Builder local_2ce8;
  BuilderFor<capnp::DynamicList> local_2ca8;
  Builder local_2c70;
  BuilderFor<capnp::DynamicStruct> local_2c30;
  Builder local_2c00;
  BuilderFor<capnp::Text> local_2bc0;
  char (*local_2ba8) [4];
  undefined1 local_2ba0 [8];
  DebugComparison<const_char_(&)[4],_capnp::Text::Builder> _kjCondition_21;
  ArrayPtr<const_char> local_2b58;
  Builder local_2b48;
  BuilderFor<capnp::DynamicList> local_2b08;
  Builder local_2ad0;
  BuilderFor<capnp::DynamicStruct> local_2a90;
  Builder local_2a60;
  BuilderFor<unsigned_long> local_2a20;
  unsigned_long local_2a18;
  bool local_2a09;
  undefined1 auStack_2a08 [7];
  bool _kj_shouldLog_13;
  ArrayPtr<const_char> local_29f8;
  Builder local_29e8;
  BuilderFor<capnp::DynamicList> local_29a8;
  Builder local_2970;
  BuilderFor<capnp::DynamicStruct> local_2930;
  Builder local_2900;
  BuilderFor<unsigned_long> local_28c0;
  unsigned_long local_28b8;
  DebugExpression<unsigned_long> local_28b0;
  undefined1 local_28a8 [8];
  DebugComparison<unsigned_long,_unsigned_long> _kjCondition_20;
  ArrayPtr<const_char> local_2870;
  Builder local_2860;
  BuilderFor<capnp::DynamicList> local_2820;
  Builder local_27e8;
  BuilderFor<capnp::DynamicStruct> local_27a8;
  Builder local_2778;
  BuilderFor<unsigned_long> local_2738;
  unsigned_long local_2730;
  bool local_2721;
  undefined1 auStack_2720 [7];
  bool _kj_shouldLog_12;
  ArrayPtr<const_char> local_2710;
  Builder local_2700;
  BuilderFor<capnp::DynamicList> local_26c0;
  Builder local_2688;
  BuilderFor<capnp::DynamicStruct> local_2648;
  Builder local_2618;
  BuilderFor<unsigned_long> local_25d8;
  unsigned_long local_25d0;
  DebugExpression<unsigned_long> local_25c8;
  undefined1 local_25c0 [8];
  DebugComparison<unsigned_long,_unsigned_long> _kjCondition_19;
  ArrayPtr<const_char> local_2588;
  Builder local_2578;
  BuilderFor<capnp::DynamicList> local_2538;
  Builder local_2500;
  BuilderFor<capnp::DynamicStruct> local_24c0;
  Builder local_2490;
  BuilderFor<unsigned_int> local_244c;
  uint local_2448;
  bool local_2441;
  undefined1 auStack_2440 [7];
  bool _kj_shouldLog_11;
  ArrayPtr<const_char> local_2430;
  Builder local_2420;
  BuilderFor<capnp::DynamicList> local_23e0;
  Builder local_23a8;
  BuilderFor<capnp::DynamicStruct> local_2368;
  Builder local_2338;
  BuilderFor<unsigned_int> local_22f4;
  uint local_22f0;
  DebugExpression<unsigned_int> local_22ec;
  undefined1 local_22e8 [8];
  DebugComparison<unsigned_int,_unsigned_int> _kjCondition_18;
  ArrayPtr<const_char> local_22b8;
  Builder local_22a8;
  BuilderFor<capnp::DynamicList> local_2268;
  Builder local_2230;
  BuilderFor<capnp::DynamicStruct> local_21f0;
  Builder local_21c0;
  BuilderFor<unsigned_int> local_217c;
  uint local_2178;
  bool local_2171;
  undefined1 auStack_2170 [7];
  bool _kj_shouldLog_10;
  ArrayPtr<const_char> local_2160;
  Builder local_2150;
  BuilderFor<capnp::DynamicList> local_2110;
  Builder local_20d8;
  BuilderFor<capnp::DynamicStruct> local_2098;
  Builder local_2068;
  BuilderFor<unsigned_int> local_2024;
  uint local_2020;
  DebugExpression<unsigned_int> local_201c;
  undefined1 local_2018 [8];
  DebugComparison<unsigned_int,_unsigned_int> _kjCondition_17;
  ArrayPtr<const_char> local_1fe8;
  Builder local_1fd8;
  BuilderFor<capnp::DynamicList> local_1f98;
  Builder local_1f60;
  BuilderFor<capnp::DynamicStruct> local_1f20;
  Builder local_1ef0;
  BuilderFor<unsigned_short> local_1eaa;
  uint local_1ea8;
  bool local_1ea1;
  undefined1 auStack_1ea0 [7];
  bool _kj_shouldLog_9;
  ArrayPtr<const_char> local_1e90;
  Builder local_1e80;
  BuilderFor<capnp::DynamicList> local_1e40;
  Builder local_1e08;
  BuilderFor<capnp::DynamicStruct> local_1dc8;
  Builder local_1d98;
  BuilderFor<unsigned_short> local_1d52;
  uint local_1d50;
  DebugExpression<unsigned_int> local_1d4c;
  undefined1 local_1d48 [8];
  DebugComparison<unsigned_int,_unsigned_short> _kjCondition_16;
  ArrayPtr<const_char> local_1d18;
  Builder local_1d08;
  BuilderFor<capnp::DynamicList> local_1cc8;
  Builder local_1c90;
  BuilderFor<capnp::DynamicStruct> local_1c50;
  Builder local_1c20;
  BuilderFor<unsigned_short> local_1bda;
  uint local_1bd8;
  bool local_1bd1;
  undefined1 auStack_1bd0 [7];
  bool _kj_shouldLog_8;
  ArrayPtr<const_char> local_1bc0;
  Builder local_1bb0;
  BuilderFor<capnp::DynamicList> local_1b70;
  Builder local_1b38;
  BuilderFor<capnp::DynamicStruct> local_1af8;
  Builder local_1ac8;
  BuilderFor<unsigned_short> local_1a82;
  uint local_1a80;
  DebugExpression<unsigned_int> local_1a7c;
  undefined1 local_1a78 [8];
  DebugComparison<unsigned_int,_unsigned_short> _kjCondition_15;
  ArrayPtr<const_char> local_1a48;
  Builder local_1a38;
  BuilderFor<capnp::DynamicList> local_19f8;
  Builder local_19c0;
  BuilderFor<capnp::DynamicStruct> local_1980;
  Builder local_1950;
  BuilderFor<unsigned_char> local_1909;
  uint local_1908;
  bool local_1901;
  undefined1 auStack_1900 [7];
  bool _kj_shouldLog_7;
  ArrayPtr<const_char> local_18f0;
  Builder local_18e0;
  BuilderFor<capnp::DynamicList> local_18a0;
  Builder local_1868;
  BuilderFor<capnp::DynamicStruct> local_1828;
  Builder local_17f8;
  BuilderFor<unsigned_char> local_17b1;
  uint local_17b0;
  DebugExpression<unsigned_int> local_17ac;
  undefined1 local_17a8 [8];
  DebugComparison<unsigned_int,_unsigned_char> _kjCondition_14;
  ArrayPtr<const_char> local_1778;
  Builder local_1768;
  BuilderFor<capnp::DynamicList> local_1728;
  Builder local_16f0;
  BuilderFor<capnp::DynamicStruct> local_16b0;
  Builder local_1680;
  BuilderFor<unsigned_char> local_1639;
  uint local_1638;
  bool local_1631;
  undefined1 auStack_1630 [7];
  bool _kj_shouldLog_6;
  ArrayPtr<const_char> local_1620;
  Builder local_1610;
  BuilderFor<capnp::DynamicList> local_15d0;
  Builder local_1598;
  BuilderFor<capnp::DynamicStruct> local_1558;
  Builder local_1528;
  BuilderFor<unsigned_char> local_14e1;
  uint local_14e0;
  DebugExpression<unsigned_int> local_14dc;
  undefined1 local_14d8 [8];
  DebugComparison<unsigned_int,_unsigned_char> _kjCondition_13;
  undefined1 auStack_14b0 [7];
  bool _kj_shouldLog_5;
  ArrayPtr<const_char> local_14a0;
  Builder local_1490;
  BuilderFor<capnp::DynamicList> local_1450;
  Builder local_1418;
  BuilderFor<capnp::DynamicStruct> local_13d8;
  Builder local_13a8;
  bool local_1363;
  DebugExpression<bool> local_1362;
  bool local_1361;
  undefined1 auStack_1360 [6];
  DebugExpression<bool> _kjCondition_12;
  bool _kj_shouldLog_4;
  ArrayPtr<const_char> local_1350;
  Builder local_1340;
  BuilderFor<capnp::DynamicList> local_1300;
  Builder local_12c8;
  BuilderFor<capnp::DynamicStruct> local_1288;
  Builder local_1258;
  bool local_1213;
  DebugExpression<bool> local_1212;
  bool local_1211;
  undefined1 auStack_1210 [6];
  DebugExpression<bool> _kjCondition_11;
  bool _kj_shouldLog_3;
  ArrayPtr<const_char> local_1200;
  Builder local_11f0;
  BuilderFor<capnp::DynamicList> local_11b0;
  Builder local_1178;
  BuilderFor<capnp::DynamicStruct> local_1138;
  Builder local_1108;
  bool local_10c3;
  DebugExpression<bool> local_10c2;
  bool local_10c1;
  undefined1 auStack_10c0 [6];
  DebugExpression<bool> _kjCondition_10;
  bool _kj_shouldLog_2;
  ArrayPtr<const_char> local_10b0;
  Builder local_10a0;
  BuilderFor<capnp::DynamicList> local_1060;
  Builder local_1028;
  BuilderFor<capnp::DynamicStruct> local_fe8;
  Builder local_fb8;
  bool local_f73;
  DebugExpression<bool> local_f72 [2];
  undefined1 auStack_f70 [6];
  DebugExpression<bool> _kjCondition_9;
  ArrayPtr<const_char> local_f60;
  Builder local_f50;
  BuilderFor<capnp::DynamicList> local_f10;
  Builder local_ed8;
  BuilderFor<capnp::DynamicStruct> local_e98;
  Builder local_e68;
  Void local_e23;
  bool local_e22;
  undefined1 auStack_e20 [6];
  bool _kj_shouldLog_1;
  ArrayPtr<const_char> local_e10;
  Builder local_e00;
  BuilderFor<capnp::DynamicList> local_dc0;
  Builder local_d88;
  BuilderFor<capnp::DynamicStruct> local_d48;
  Builder local_d18;
  Void local_cd1;
  Void *local_cd0;
  undefined1 local_cc8 [8];
  DebugComparison<const_capnp::Void_&,_capnp::Void> _kjCondition_8;
  ArrayPtr<const_char> local_c98;
  ArrayPtr<const_char> local_c88;
  Builder local_c78;
  BuilderFor<capnp::DynamicList> local_c38;
  Builder local_c00;
  BuilderFor<capnp::DynamicStruct> local_bc0;
  Builder local_b90;
  Void local_b4b;
  bool local_b4a;
  undefined1 auStack_b48 [6];
  bool _kj_shouldLog;
  ArrayPtr<const_char> local_b38;
  Builder local_b28;
  BuilderFor<capnp::DynamicList> local_ae8;
  Builder local_ab0;
  BuilderFor<capnp::DynamicStruct> local_a70;
  Builder local_a40;
  Void local_9f9;
  Void *local_9f8;
  undefined1 local_9f0 [8];
  DebugComparison<const_capnp::Void_&,_capnp::Void> _kjCondition_7;
  Builder local_9b8;
  BuilderFor<capnp::DynamicList> local_978;
  uint local_940;
  uint local_93c;
  Fault local_938;
  Fault f_6;
  Builder local_920;
  BuilderFor<capnp::DynamicList> local_8e0;
  uint local_8a4;
  uint local_8a0;
  DebugExpression<unsigned_int> local_89c;
  undefined1 local_898 [8];
  DebugComparison<unsigned_int,_unsigned_int> _kjCondition_6;
  Builder local_868;
  BuilderFor<capnp::DynamicList> local_828;
  uint local_7f0;
  uint local_7ec;
  Fault local_7e8;
  Fault f_5;
  Builder local_7d0;
  BuilderFor<capnp::DynamicList> local_790;
  uint local_754;
  uint local_750;
  DebugExpression<unsigned_int> local_74c;
  undefined1 local_748 [8];
  DebugComparison<unsigned_int,_unsigned_int> _kjCondition_5;
  Builder local_718;
  BuilderFor<capnp::DynamicList> local_6d8;
  uint local_6a0;
  uint local_69c;
  Fault local_698;
  Fault f_4;
  Builder local_680;
  BuilderFor<capnp::DynamicList> local_640;
  uint local_604;
  uint local_600;
  DebugExpression<unsigned_int> local_5fc;
  undefined1 local_5f8 [8];
  DebugComparison<unsigned_int,_unsigned_int> _kjCondition_4;
  Builder local_5c8;
  BuilderFor<capnp::DynamicList> local_588;
  uint local_550;
  uint local_54c;
  Fault local_548;
  Fault f_3;
  Builder local_530;
  BuilderFor<capnp::DynamicList> local_4f0;
  uint local_4b4;
  uint local_4b0;
  DebugExpression<unsigned_int> local_4ac;
  undefined1 local_4a8 [8];
  DebugComparison<unsigned_int,_unsigned_int> _kjCondition_3;
  Builder local_478;
  BuilderFor<capnp::DynamicList> local_438;
  uint local_400;
  uint local_3fc;
  Fault local_3f8;
  Fault f_2;
  Builder local_3e0;
  BuilderFor<capnp::DynamicList> local_3a0;
  uint local_364;
  uint local_360;
  DebugExpression<unsigned_int> local_35c;
  undefined1 local_358 [8];
  DebugComparison<unsigned_int,_unsigned_int> _kjCondition_2;
  Builder local_328;
  BuilderFor<capnp::DynamicList> local_2e8;
  uint local_2b0;
  uint local_2ac;
  Fault local_2a8;
  Fault f_1;
  Builder local_290;
  BuilderFor<capnp::DynamicList> local_250;
  uint local_214;
  uint local_210;
  DebugExpression<unsigned_int> local_20c;
  undefined1 local_208 [8];
  DebugComparison<unsigned_int,_unsigned_int> _kjCondition_1;
  Builder local_1d8;
  BuilderFor<capnp::DynamicList> local_198;
  uint local_160;
  uint local_15c;
  Fault local_158;
  Fault f;
  Builder local_140;
  BuilderFor<capnp::DynamicList> local_100;
  uint local_c4;
  uint local_c0;
  DebugExpression<unsigned_int> local_bc;
  undefined1 local_b8 [8];
  DebugComparison<unsigned_int,_unsigned_int> _kjCondition;
  ArrayPtr<const_char> local_88;
  Builder local_78;
  undefined1 local_38 [8];
  BuilderFor<capnp::DynamicStruct> lists;
  
  kj::StringPtr::StringPtr((StringPtr *)&local_88,"lists");
  DynamicStruct::Builder::get(&local_78,(Builder *)&stack0x00000008,(StringPtr)local_88);
  DynamicValue::Builder::as<capnp::DynamicStruct>
            ((BuilderFor<capnp::DynamicStruct> *)local_38,&local_78);
  DynamicValue::Builder::~Builder(&local_78);
  local_c0 = 2;
  local_bc = kj::_::DebugExpressionStart::operator<<
                       ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_c0);
  kj::StringPtr::StringPtr((StringPtr *)&f,"list0");
  DynamicStruct::Builder::get(&local_140,(Builder *)local_38,(StringPtr)_f);
  DynamicValue::Builder::as<capnp::DynamicList>(&local_100,&local_140);
  local_c4 = DynamicList::Builder::size(&local_100);
  kj::_::DebugExpression<unsigned_int>::operator==
            ((DebugComparison<unsigned_int,_unsigned_int> *)local_b8,&local_bc,&local_c4);
  DynamicValue::Builder::~Builder(&local_140);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_b8);
  if (!bVar1) {
    local_15c = 2;
    kj::StringPtr::StringPtr((StringPtr *)&_kjCondition_1.result,"list0");
    DynamicStruct::Builder::get(&local_1d8,(Builder *)local_38,(StringPtr)stack0xfffffffffffffe18);
    DynamicValue::Builder::as<capnp::DynamicList>(&local_198,&local_1d8);
    local_160 = DynamicList::Builder::size(&local_198);
    kj::_::Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_int,unsigned_int>&,unsigned_int,unsigned_int>
              (&local_158,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x30c,FAILED,"(2u) == (lists.get(\"list0\").template as<DynamicList>().size())",
               "_kjCondition,2u, lists.get(\"list0\").template as<DynamicList>().size()",
               (DebugComparison<unsigned_int,_unsigned_int> *)local_b8,&local_15c,&local_160);
    DynamicValue::Builder::~Builder(&local_1d8);
    kj::_::Debug::Fault::fatal(&local_158);
  }
  local_210 = 4;
  local_20c = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_210);
  kj::StringPtr::StringPtr((StringPtr *)&f_1,"list1");
  DynamicStruct::Builder::get(&local_290,(Builder *)local_38,(StringPtr)_f_1);
  DynamicValue::Builder::as<capnp::DynamicList>(&local_250,&local_290);
  local_214 = DynamicList::Builder::size(&local_250);
  kj::_::DebugExpression<unsigned_int>::operator==
            ((DebugComparison<unsigned_int,_unsigned_int> *)local_208,&local_20c,&local_214);
  DynamicValue::Builder::~Builder(&local_290);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_208);
  if (!bVar1) {
    local_2ac = 4;
    kj::StringPtr::StringPtr((StringPtr *)&_kjCondition_2.result,"list1");
    DynamicStruct::Builder::get(&local_328,(Builder *)local_38,(StringPtr)stack0xfffffffffffffcc8);
    DynamicValue::Builder::as<capnp::DynamicList>(&local_2e8,&local_328);
    local_2b0 = DynamicList::Builder::size(&local_2e8);
    kj::_::Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_int,unsigned_int>&,unsigned_int,unsigned_int>
              (&local_2a8,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x30d,FAILED,"(4u) == (lists.get(\"list1\").template as<DynamicList>().size())",
               "_kjCondition,4u, lists.get(\"list1\").template as<DynamicList>().size()",
               (DebugComparison<unsigned_int,_unsigned_int> *)local_208,&local_2ac,&local_2b0);
    DynamicValue::Builder::~Builder(&local_328);
    kj::_::Debug::Fault::fatal(&local_2a8);
  }
  local_360 = 2;
  local_35c = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_360);
  kj::StringPtr::StringPtr((StringPtr *)&f_2,"list8");
  DynamicStruct::Builder::get(&local_3e0,(Builder *)local_38,(StringPtr)_f_2);
  DynamicValue::Builder::as<capnp::DynamicList>(&local_3a0,&local_3e0);
  local_364 = DynamicList::Builder::size(&local_3a0);
  kj::_::DebugExpression<unsigned_int>::operator==
            ((DebugComparison<unsigned_int,_unsigned_int> *)local_358,&local_35c,&local_364);
  DynamicValue::Builder::~Builder(&local_3e0);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_358);
  if (!bVar1) {
    local_3fc = 2;
    kj::StringPtr::StringPtr((StringPtr *)&_kjCondition_3.result,"list8");
    DynamicStruct::Builder::get(&local_478,(Builder *)local_38,(StringPtr)stack0xfffffffffffffb78);
    DynamicValue::Builder::as<capnp::DynamicList>(&local_438,&local_478);
    local_400 = DynamicList::Builder::size(&local_438);
    kj::_::Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_int,unsigned_int>&,unsigned_int,unsigned_int>
              (&local_3f8,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x30e,FAILED,"(2u) == (lists.get(\"list8\").template as<DynamicList>().size())",
               "_kjCondition,2u, lists.get(\"list8\").template as<DynamicList>().size()",
               (DebugComparison<unsigned_int,_unsigned_int> *)local_358,&local_3fc,&local_400);
    DynamicValue::Builder::~Builder(&local_478);
    kj::_::Debug::Fault::fatal(&local_3f8);
  }
  local_4b0 = 2;
  local_4ac = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_4b0);
  kj::StringPtr::StringPtr((StringPtr *)&f_3,"list16");
  DynamicStruct::Builder::get(&local_530,(Builder *)local_38,(StringPtr)_f_3);
  DynamicValue::Builder::as<capnp::DynamicList>(&local_4f0,&local_530);
  local_4b4 = DynamicList::Builder::size(&local_4f0);
  kj::_::DebugExpression<unsigned_int>::operator==
            ((DebugComparison<unsigned_int,_unsigned_int> *)local_4a8,&local_4ac,&local_4b4);
  DynamicValue::Builder::~Builder(&local_530);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_4a8);
  if (!bVar1) {
    local_54c = 2;
    kj::StringPtr::StringPtr((StringPtr *)&_kjCondition_4.result,"list16");
    DynamicStruct::Builder::get(&local_5c8,(Builder *)local_38,(StringPtr)stack0xfffffffffffffa28);
    DynamicValue::Builder::as<capnp::DynamicList>(&local_588,&local_5c8);
    local_550 = DynamicList::Builder::size(&local_588);
    kj::_::Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_int,unsigned_int>&,unsigned_int,unsigned_int>
              (&local_548,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x30f,FAILED,"(2u) == (lists.get(\"list16\").template as<DynamicList>().size())",
               "_kjCondition,2u, lists.get(\"list16\").template as<DynamicList>().size()",
               (DebugComparison<unsigned_int,_unsigned_int> *)local_4a8,&local_54c,&local_550);
    DynamicValue::Builder::~Builder(&local_5c8);
    kj::_::Debug::Fault::fatal(&local_548);
  }
  local_600 = 2;
  local_5fc = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_600);
  kj::StringPtr::StringPtr((StringPtr *)&f_4,"list32");
  DynamicStruct::Builder::get(&local_680,(Builder *)local_38,(StringPtr)_f_4);
  DynamicValue::Builder::as<capnp::DynamicList>(&local_640,&local_680);
  local_604 = DynamicList::Builder::size(&local_640);
  kj::_::DebugExpression<unsigned_int>::operator==
            ((DebugComparison<unsigned_int,_unsigned_int> *)local_5f8,&local_5fc,&local_604);
  DynamicValue::Builder::~Builder(&local_680);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_5f8);
  if (!bVar1) {
    local_69c = 2;
    kj::StringPtr::StringPtr((StringPtr *)&_kjCondition_5.result,"list32");
    DynamicStruct::Builder::get(&local_718,(Builder *)local_38,(StringPtr)stack0xfffffffffffff8d8);
    DynamicValue::Builder::as<capnp::DynamicList>(&local_6d8,&local_718);
    local_6a0 = DynamicList::Builder::size(&local_6d8);
    kj::_::Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_int,unsigned_int>&,unsigned_int,unsigned_int>
              (&local_698,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x310,FAILED,"(2u) == (lists.get(\"list32\").template as<DynamicList>().size())",
               "_kjCondition,2u, lists.get(\"list32\").template as<DynamicList>().size()",
               (DebugComparison<unsigned_int,_unsigned_int> *)local_5f8,&local_69c,&local_6a0);
    DynamicValue::Builder::~Builder(&local_718);
    kj::_::Debug::Fault::fatal(&local_698);
  }
  local_750 = 2;
  local_74c = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_750);
  kj::StringPtr::StringPtr((StringPtr *)&f_5,"list64");
  DynamicStruct::Builder::get(&local_7d0,(Builder *)local_38,(StringPtr)_f_5);
  DynamicValue::Builder::as<capnp::DynamicList>(&local_790,&local_7d0);
  local_754 = DynamicList::Builder::size(&local_790);
  kj::_::DebugExpression<unsigned_int>::operator==
            ((DebugComparison<unsigned_int,_unsigned_int> *)local_748,&local_74c,&local_754);
  DynamicValue::Builder::~Builder(&local_7d0);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_748);
  if (!bVar1) {
    local_7ec = 2;
    kj::StringPtr::StringPtr((StringPtr *)&_kjCondition_6.result,"list64");
    DynamicStruct::Builder::get(&local_868,(Builder *)local_38,(StringPtr)stack0xfffffffffffff788);
    DynamicValue::Builder::as<capnp::DynamicList>(&local_828,&local_868);
    local_7f0 = DynamicList::Builder::size(&local_828);
    kj::_::Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_int,unsigned_int>&,unsigned_int,unsigned_int>
              (&local_7e8,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x311,FAILED,"(2u) == (lists.get(\"list64\").template as<DynamicList>().size())",
               "_kjCondition,2u, lists.get(\"list64\").template as<DynamicList>().size()",
               (DebugComparison<unsigned_int,_unsigned_int> *)local_748,&local_7ec,&local_7f0);
    DynamicValue::Builder::~Builder(&local_868);
    kj::_::Debug::Fault::fatal(&local_7e8);
  }
  local_8a0 = 2;
  local_89c = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_8a0);
  kj::StringPtr::StringPtr((StringPtr *)&f_6,"listP");
  DynamicStruct::Builder::get(&local_920,(Builder *)local_38,(StringPtr)_f_6);
  DynamicValue::Builder::as<capnp::DynamicList>(&local_8e0,&local_920);
  local_8a4 = DynamicList::Builder::size(&local_8e0);
  kj::_::DebugExpression<unsigned_int>::operator==
            ((DebugComparison<unsigned_int,_unsigned_int> *)local_898,&local_89c,&local_8a4);
  DynamicValue::Builder::~Builder(&local_920);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_898);
  if (!bVar1) {
    local_93c = 2;
    kj::StringPtr::StringPtr((StringPtr *)&_kjCondition_7.result,"listP");
    DynamicStruct::Builder::get(&local_9b8,(Builder *)local_38,(StringPtr)stack0xfffffffffffff638);
    DynamicValue::Builder::as<capnp::DynamicList>(&local_978,&local_9b8);
    local_940 = DynamicList::Builder::size(&local_978);
    kj::_::Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_int,unsigned_int>&,unsigned_int,unsigned_int>
              (&local_938,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x312,FAILED,"(2u) == (lists.get(\"listP\").template as<DynamicList>().size())",
               "_kjCondition,2u, lists.get(\"listP\").template as<DynamicList>().size()",
               (DebugComparison<unsigned_int,_unsigned_int> *)local_898,&local_93c,&local_940);
    DynamicValue::Builder::~Builder(&local_9b8);
    kj::_::Debug::Fault::fatal(&local_938);
  }
  local_9f8 = (Void *)kj::_::DebugExpressionStart::operator<<
                                ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(Void *)&VOID);
  kj::StringPtr::StringPtr((StringPtr *)&local_b38,"list0");
  DynamicStruct::Builder::get(&local_b28,(Builder *)local_38,(StringPtr)local_b38);
  DynamicValue::Builder::as<capnp::DynamicList>(&local_ae8,&local_b28);
  DynamicList::Builder::operator[](&local_ab0,&local_ae8,0);
  DynamicValue::Builder::as<capnp::DynamicStruct>(&local_a70,&local_ab0);
  kj::StringPtr::StringPtr((StringPtr *)auStack_b48,"f");
  DynamicStruct::Builder::get(&local_a40,&local_a70,(StringPtr)_auStack_b48);
  DynamicValue::Builder::as<capnp::Void>(&local_a40);
  kj::_::DebugExpression<capnp::Void_const&>::operator==
            ((DebugComparison<const_capnp::Void_&,_capnp::Void> *)local_9f0,
             (DebugExpression<capnp::Void_const&> *)&local_9f8,&local_9f9);
  DynamicValue::Builder::~Builder(&local_a40);
  DynamicValue::Builder::~Builder(&local_ab0);
  DynamicValue::Builder::~Builder(&local_b28);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_9f0);
  if (!bVar1) {
    local_b4a = kj::_::Debug::shouldLog(ERROR);
    while (local_b4a != false) {
      kj::StringPtr::StringPtr((StringPtr *)&local_c88,"list0");
      DynamicStruct::Builder::get(&local_c78,(Builder *)local_38,(StringPtr)local_c88);
      DynamicValue::Builder::as<capnp::DynamicList>(&local_c38,&local_c78);
      DynamicList::Builder::operator[](&local_c00,&local_c38,0);
      DynamicValue::Builder::as<capnp::DynamicStruct>(&local_bc0,&local_c00);
      kj::StringPtr::StringPtr((StringPtr *)&local_c98,"f");
      DynamicStruct::Builder::get(&local_b90,&local_bc0,(StringPtr)local_c98);
      DynamicValue::Builder::as<capnp::Void>(&local_b90);
      kj::_::Debug::
      log<char_const(&)[136],kj::_::DebugComparison<capnp::Void_const&,capnp::Void>&,capnp::Void_const&,capnp::Void>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x314,ERROR,
                 "\"failed: expected \" \"(VOID) == (lists.get(\\\"list0\\\").template as<DynamicList>()[0].template as<DynamicStruct>().get(\\\"f\\\").template as<Void>())\", _kjCondition, VOID, lists.get(\"list0\").template as<DynamicList>()[0].template as<DynamicStruct>().get(\"f\").template as<Void>()"
                 ,(char (*) [136])
                  "failed: expected (VOID) == (lists.get(\"list0\").template as<DynamicList>()[0].template as<DynamicStruct>().get(\"f\").template as<Void>())"
                 ,(DebugComparison<const_capnp::Void_&,_capnp::Void> *)local_9f0,(Void *)&VOID,
                 &local_b4b);
      DynamicValue::Builder::~Builder(&local_b90);
      DynamicValue::Builder::~Builder(&local_c00);
      DynamicValue::Builder::~Builder(&local_c78);
      local_b4a = false;
    }
  }
  local_cd0 = (Void *)kj::_::DebugExpressionStart::operator<<
                                ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(Void *)&VOID);
  kj::StringPtr::StringPtr((StringPtr *)&local_e10,"list0");
  DynamicStruct::Builder::get(&local_e00,(Builder *)local_38,(StringPtr)local_e10);
  DynamicValue::Builder::as<capnp::DynamicList>(&local_dc0,&local_e00);
  DynamicList::Builder::operator[](&local_d88,&local_dc0,1);
  DynamicValue::Builder::as<capnp::DynamicStruct>(&local_d48,&local_d88);
  kj::StringPtr::StringPtr((StringPtr *)auStack_e20,"f");
  DynamicStruct::Builder::get(&local_d18,&local_d48,(StringPtr)_auStack_e20);
  DynamicValue::Builder::as<capnp::Void>(&local_d18);
  kj::_::DebugExpression<capnp::Void_const&>::operator==
            ((DebugComparison<const_capnp::Void_&,_capnp::Void> *)local_cc8,
             (DebugExpression<capnp::Void_const&> *)&local_cd0,&local_cd1);
  DynamicValue::Builder::~Builder(&local_d18);
  DynamicValue::Builder::~Builder(&local_d88);
  DynamicValue::Builder::~Builder(&local_e00);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_cc8);
  if (!bVar1) {
    local_e22 = kj::_::Debug::shouldLog(ERROR);
    while (local_e22 != false) {
      kj::StringPtr::StringPtr((StringPtr *)&local_f60,"list0");
      DynamicStruct::Builder::get(&local_f50,(Builder *)local_38,(StringPtr)local_f60);
      DynamicValue::Builder::as<capnp::DynamicList>(&local_f10,&local_f50);
      DynamicList::Builder::operator[](&local_ed8,&local_f10,1);
      DynamicValue::Builder::as<capnp::DynamicStruct>(&local_e98,&local_ed8);
      kj::StringPtr::StringPtr((StringPtr *)auStack_f70,"f");
      DynamicStruct::Builder::get(&local_e68,&local_e98,(StringPtr)_auStack_f70);
      DynamicValue::Builder::as<capnp::Void>(&local_e68);
      kj::_::Debug::
      log<char_const(&)[136],kj::_::DebugComparison<capnp::Void_const&,capnp::Void>&,capnp::Void_const&,capnp::Void>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x315,ERROR,
                 "\"failed: expected \" \"(VOID) == (lists.get(\\\"list0\\\").template as<DynamicList>()[1].template as<DynamicStruct>().get(\\\"f\\\").template as<Void>())\", _kjCondition, VOID, lists.get(\"list0\").template as<DynamicList>()[1].template as<DynamicStruct>().get(\"f\").template as<Void>()"
                 ,(char (*) [136])
                  "failed: expected (VOID) == (lists.get(\"list0\").template as<DynamicList>()[1].template as<DynamicStruct>().get(\"f\").template as<Void>())"
                 ,(DebugComparison<const_capnp::Void_&,_capnp::Void> *)local_cc8,(Void *)&VOID,
                 &local_e23);
      DynamicValue::Builder::~Builder(&local_e68);
      DynamicValue::Builder::~Builder(&local_ed8);
      DynamicValue::Builder::~Builder(&local_f50);
      local_e22 = false;
    }
  }
  kj::StringPtr::StringPtr((StringPtr *)&local_10b0,"list1");
  DynamicStruct::Builder::get(&local_10a0,(Builder *)local_38,(StringPtr)local_10b0);
  DynamicValue::Builder::as<capnp::DynamicList>(&local_1060,&local_10a0);
  DynamicList::Builder::operator[](&local_1028,&local_1060,0);
  DynamicValue::Builder::as<capnp::DynamicStruct>(&local_fe8,&local_1028);
  kj::StringPtr::StringPtr((StringPtr *)auStack_10c0,"f");
  DynamicStruct::Builder::get(&local_fb8,&local_fe8,(StringPtr)_auStack_10c0);
  local_f73 = DynamicValue::Builder::as<bool>(&local_fb8);
  local_f72[0] = kj::_::DebugExpressionStart::operator<<
                           ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_f73);
  DynamicValue::Builder::~Builder(&local_fb8);
  DynamicValue::Builder::~Builder(&local_1028);
  DynamicValue::Builder::~Builder(&local_10a0);
  bVar1 = kj::_::DebugExpression::operator_cast_to_bool((DebugExpression *)local_f72);
  if (!bVar1) {
    local_10c1 = kj::_::Debug::shouldLog(ERROR);
    while (local_10c1 != false) {
      kj::_::Debug::log<char_const(&)[124],kj::_::DebugExpression<bool>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x316,ERROR,
                 "\"failed: expected \" \"lists.get(\\\"list1\\\").template as<DynamicList>()[0].template as<DynamicStruct>().get(\\\"f\\\").template as<bool>()\", _kjCondition"
                 ,(char (*) [124])
                  "failed: expected lists.get(\"list1\").template as<DynamicList>()[0].template as<DynamicStruct>().get(\"f\").template as<bool>()"
                 ,local_f72);
      local_10c1 = false;
    }
  }
  kj::StringPtr::StringPtr((StringPtr *)&local_1200,"list1");
  DynamicStruct::Builder::get(&local_11f0,(Builder *)local_38,(StringPtr)local_1200);
  DynamicValue::Builder::as<capnp::DynamicList>(&local_11b0,&local_11f0);
  DynamicList::Builder::operator[](&local_1178,&local_11b0,1);
  DynamicValue::Builder::as<capnp::DynamicStruct>(&local_1138,&local_1178);
  kj::StringPtr::StringPtr((StringPtr *)auStack_1210,"f");
  DynamicStruct::Builder::get(&local_1108,&local_1138,(StringPtr)_auStack_1210);
  BVar2 = DynamicValue::Builder::as<bool>(&local_1108);
  local_10c3 = (bool)(~BVar2 & 1);
  local_10c2 = kj::_::DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_10c3);
  DynamicValue::Builder::~Builder(&local_1108);
  DynamicValue::Builder::~Builder(&local_1178);
  DynamicValue::Builder::~Builder(&local_11f0);
  bVar1 = kj::_::DebugExpression::operator_cast_to_bool((DebugExpression *)&local_10c2);
  if (!bVar1) {
    local_1211 = kj::_::Debug::shouldLog(ERROR);
    while (local_1211 != false) {
      kj::_::Debug::log<char_const(&)[127],kj::_::DebugExpression<bool>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x317,ERROR,
                 "\"failed: expected \" \"!(lists.get(\\\"list1\\\").template as<DynamicList>()[1].template as<DynamicStruct>().get(\\\"f\\\").template as<bool>())\", _kjCondition"
                 ,(char (*) [127])
                  "failed: expected !(lists.get(\"list1\").template as<DynamicList>()[1].template as<DynamicStruct>().get(\"f\").template as<bool>())"
                 ,&local_10c2);
      local_1211 = false;
    }
  }
  kj::StringPtr::StringPtr((StringPtr *)&local_1350,"list1");
  DynamicStruct::Builder::get(&local_1340,(Builder *)local_38,(StringPtr)local_1350);
  DynamicValue::Builder::as<capnp::DynamicList>(&local_1300,&local_1340);
  DynamicList::Builder::operator[](&local_12c8,&local_1300,2);
  DynamicValue::Builder::as<capnp::DynamicStruct>(&local_1288,&local_12c8);
  kj::StringPtr::StringPtr((StringPtr *)auStack_1360,"f");
  DynamicStruct::Builder::get(&local_1258,&local_1288,(StringPtr)_auStack_1360);
  local_1213 = DynamicValue::Builder::as<bool>(&local_1258);
  local_1212 = kj::_::DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_1213);
  DynamicValue::Builder::~Builder(&local_1258);
  DynamicValue::Builder::~Builder(&local_12c8);
  DynamicValue::Builder::~Builder(&local_1340);
  bVar1 = kj::_::DebugExpression::operator_cast_to_bool((DebugExpression *)&local_1212);
  if (!bVar1) {
    local_1361 = kj::_::Debug::shouldLog(ERROR);
    while (local_1361 != false) {
      kj::_::Debug::log<char_const(&)[124],kj::_::DebugExpression<bool>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x318,ERROR,
                 "\"failed: expected \" \"lists.get(\\\"list1\\\").template as<DynamicList>()[2].template as<DynamicStruct>().get(\\\"f\\\").template as<bool>()\", _kjCondition"
                 ,(char (*) [124])
                  "failed: expected lists.get(\"list1\").template as<DynamicList>()[2].template as<DynamicStruct>().get(\"f\").template as<bool>()"
                 ,&local_1212);
      local_1361 = false;
    }
  }
  kj::StringPtr::StringPtr((StringPtr *)&local_14a0,"list1");
  DynamicStruct::Builder::get(&local_1490,(Builder *)local_38,(StringPtr)local_14a0);
  DynamicValue::Builder::as<capnp::DynamicList>(&local_1450,&local_1490);
  DynamicList::Builder::operator[](&local_1418,&local_1450,3);
  DynamicValue::Builder::as<capnp::DynamicStruct>(&local_13d8,&local_1418);
  kj::StringPtr::StringPtr((StringPtr *)auStack_14b0,"f");
  DynamicStruct::Builder::get(&local_13a8,&local_13d8,(StringPtr)_auStack_14b0);
  local_1363 = DynamicValue::Builder::as<bool>(&local_13a8);
  local_1362 = kj::_::DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_1363);
  DynamicValue::Builder::~Builder(&local_13a8);
  DynamicValue::Builder::~Builder(&local_1418);
  DynamicValue::Builder::~Builder(&local_1490);
  bVar1 = kj::_::DebugExpression::operator_cast_to_bool((DebugExpression *)&local_1362);
  if (!bVar1) {
    _kjCondition_13._31_1_ = kj::_::Debug::shouldLog(ERROR);
    while (_kjCondition_13._31_1_ != '\0') {
      kj::_::Debug::log<char_const(&)[124],kj::_::DebugExpression<bool>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x319,ERROR,
                 "\"failed: expected \" \"lists.get(\\\"list1\\\").template as<DynamicList>()[3].template as<DynamicStruct>().get(\\\"f\\\").template as<bool>()\", _kjCondition"
                 ,(char (*) [124])
                  "failed: expected lists.get(\"list1\").template as<DynamicList>()[3].template as<DynamicStruct>().get(\"f\").template as<bool>()"
                 ,&local_1362);
      _kjCondition_13._31_1_ = 0;
    }
  }
  local_14e0 = 0x7b;
  local_14dc = kj::_::DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_14e0);
  kj::StringPtr::StringPtr((StringPtr *)&local_1620,"list8");
  DynamicStruct::Builder::get(&local_1610,(Builder *)local_38,(StringPtr)local_1620);
  DynamicValue::Builder::as<capnp::DynamicList>(&local_15d0,&local_1610);
  DynamicList::Builder::operator[](&local_1598,&local_15d0,0);
  DynamicValue::Builder::as<capnp::DynamicStruct>(&local_1558,&local_1598);
  kj::StringPtr::StringPtr((StringPtr *)auStack_1630,"f");
  DynamicStruct::Builder::get(&local_1528,&local_1558,(StringPtr)_auStack_1630);
  local_14e1 = DynamicValue::Builder::as<unsigned_char>(&local_1528);
  kj::_::DebugExpression<unsigned_int>::operator==
            ((DebugComparison<unsigned_int,_unsigned_char> *)local_14d8,&local_14dc,&local_14e1);
  DynamicValue::Builder::~Builder(&local_1528);
  DynamicValue::Builder::~Builder(&local_1598);
  DynamicValue::Builder::~Builder(&local_1610);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_14d8);
  if (!bVar1) {
    local_1631 = kj::_::Debug::shouldLog(ERROR);
    while (local_1631 != false) {
      local_1638 = 0x7b;
      kj::StringPtr::StringPtr((StringPtr *)&local_1778,"list8");
      DynamicStruct::Builder::get(&local_1768,(Builder *)local_38,(StringPtr)local_1778);
      DynamicValue::Builder::as<capnp::DynamicList>(&local_1728,&local_1768);
      DynamicList::Builder::operator[](&local_16f0,&local_1728,0);
      DynamicValue::Builder::as<capnp::DynamicStruct>(&local_16b0,&local_16f0);
      kj::StringPtr::StringPtr((StringPtr *)&_kjCondition_14.result,"f");
      DynamicStruct::Builder::get(&local_1680,&local_16b0,(StringPtr)stack0xffffffffffffe878);
      local_1639 = DynamicValue::Builder::as<unsigned_char>(&local_1680);
      kj::_::Debug::
      log<char_const(&)[139],kj::_::DebugComparison<unsigned_int,unsigned_char>&,unsigned_int,unsigned_char>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x31a,ERROR,
                 "\"failed: expected \" \"(123u) == (lists.get(\\\"list8\\\").template as<DynamicList>()[0].template as<DynamicStruct>().get(\\\"f\\\").template as<uint8_t>())\", _kjCondition, 123u, lists.get(\"list8\").template as<DynamicList>()[0].template as<DynamicStruct>().get(\"f\").template as<uint8_t>()"
                 ,(char (*) [139])
                  "failed: expected (123u) == (lists.get(\"list8\").template as<DynamicList>()[0].template as<DynamicStruct>().get(\"f\").template as<uint8_t>())"
                 ,(DebugComparison<unsigned_int,_unsigned_char> *)local_14d8,&local_1638,&local_1639
                );
      DynamicValue::Builder::~Builder(&local_1680);
      DynamicValue::Builder::~Builder(&local_16f0);
      DynamicValue::Builder::~Builder(&local_1768);
      local_1631 = false;
    }
  }
  local_17b0 = 0x2d;
  local_17ac = kj::_::DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_17b0);
  kj::StringPtr::StringPtr((StringPtr *)&local_18f0,"list8");
  DynamicStruct::Builder::get(&local_18e0,(Builder *)local_38,(StringPtr)local_18f0);
  DynamicValue::Builder::as<capnp::DynamicList>(&local_18a0,&local_18e0);
  DynamicList::Builder::operator[](&local_1868,&local_18a0,1);
  DynamicValue::Builder::as<capnp::DynamicStruct>(&local_1828,&local_1868);
  kj::StringPtr::StringPtr((StringPtr *)auStack_1900,"f");
  DynamicStruct::Builder::get(&local_17f8,&local_1828,(StringPtr)_auStack_1900);
  local_17b1 = DynamicValue::Builder::as<unsigned_char>(&local_17f8);
  kj::_::DebugExpression<unsigned_int>::operator==
            ((DebugComparison<unsigned_int,_unsigned_char> *)local_17a8,&local_17ac,&local_17b1);
  DynamicValue::Builder::~Builder(&local_17f8);
  DynamicValue::Builder::~Builder(&local_1868);
  DynamicValue::Builder::~Builder(&local_18e0);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_17a8);
  if (!bVar1) {
    local_1901 = kj::_::Debug::shouldLog(ERROR);
    while (local_1901 != false) {
      local_1908 = 0x2d;
      kj::StringPtr::StringPtr((StringPtr *)&local_1a48,"list8");
      DynamicStruct::Builder::get(&local_1a38,(Builder *)local_38,(StringPtr)local_1a48);
      DynamicValue::Builder::as<capnp::DynamicList>(&local_19f8,&local_1a38);
      DynamicList::Builder::operator[](&local_19c0,&local_19f8,1);
      DynamicValue::Builder::as<capnp::DynamicStruct>(&local_1980,&local_19c0);
      kj::StringPtr::StringPtr((StringPtr *)&_kjCondition_15.result,"f");
      DynamicStruct::Builder::get(&local_1950,&local_1980,(StringPtr)stack0xffffffffffffe5a8);
      local_1909 = DynamicValue::Builder::as<unsigned_char>(&local_1950);
      kj::_::Debug::
      log<char_const(&)[138],kj::_::DebugComparison<unsigned_int,unsigned_char>&,unsigned_int,unsigned_char>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x31b,ERROR,
                 "\"failed: expected \" \"(45u) == (lists.get(\\\"list8\\\").template as<DynamicList>()[1].template as<DynamicStruct>().get(\\\"f\\\").template as<uint8_t>())\", _kjCondition, 45u, lists.get(\"list8\").template as<DynamicList>()[1].template as<DynamicStruct>().get(\"f\").template as<uint8_t>()"
                 ,(char (*) [138])
                  "failed: expected (45u) == (lists.get(\"list8\").template as<DynamicList>()[1].template as<DynamicStruct>().get(\"f\").template as<uint8_t>())"
                 ,(DebugComparison<unsigned_int,_unsigned_char> *)local_17a8,&local_1908,&local_1909
                );
      DynamicValue::Builder::~Builder(&local_1950);
      DynamicValue::Builder::~Builder(&local_19c0);
      DynamicValue::Builder::~Builder(&local_1a38);
      local_1901 = false;
    }
  }
  local_1a80 = 0x3039;
  local_1a7c = kj::_::DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_1a80);
  kj::StringPtr::StringPtr((StringPtr *)&local_1bc0,"list16");
  DynamicStruct::Builder::get(&local_1bb0,(Builder *)local_38,(StringPtr)local_1bc0);
  DynamicValue::Builder::as<capnp::DynamicList>(&local_1b70,&local_1bb0);
  DynamicList::Builder::operator[](&local_1b38,&local_1b70,0);
  DynamicValue::Builder::as<capnp::DynamicStruct>(&local_1af8,&local_1b38);
  kj::StringPtr::StringPtr((StringPtr *)auStack_1bd0,"f");
  DynamicStruct::Builder::get(&local_1ac8,&local_1af8,(StringPtr)_auStack_1bd0);
  local_1a82 = DynamicValue::Builder::as<unsigned_short>(&local_1ac8);
  kj::_::DebugExpression<unsigned_int>::operator==
            ((DebugComparison<unsigned_int,_unsigned_short> *)local_1a78,&local_1a7c,&local_1a82);
  DynamicValue::Builder::~Builder(&local_1ac8);
  DynamicValue::Builder::~Builder(&local_1b38);
  DynamicValue::Builder::~Builder(&local_1bb0);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_1a78);
  if (!bVar1) {
    local_1bd1 = kj::_::Debug::shouldLog(ERROR);
    while (local_1bd1 != false) {
      local_1bd8 = 0x3039;
      kj::StringPtr::StringPtr((StringPtr *)&local_1d18,"list16");
      DynamicStruct::Builder::get(&local_1d08,(Builder *)local_38,(StringPtr)local_1d18);
      DynamicValue::Builder::as<capnp::DynamicList>(&local_1cc8,&local_1d08);
      DynamicList::Builder::operator[](&local_1c90,&local_1cc8,0);
      DynamicValue::Builder::as<capnp::DynamicStruct>(&local_1c50,&local_1c90);
      kj::StringPtr::StringPtr((StringPtr *)&_kjCondition_16.result,"f");
      DynamicStruct::Builder::get(&local_1c20,&local_1c50,(StringPtr)stack0xffffffffffffe2d8);
      local_1bda = DynamicValue::Builder::as<unsigned_short>(&local_1c20);
      kj::_::Debug::
      log<char_const(&)[143],kj::_::DebugComparison<unsigned_int,unsigned_short>&,unsigned_int,unsigned_short>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x31c,ERROR,
                 "\"failed: expected \" \"(12345u) == (lists.get(\\\"list16\\\").template as<DynamicList>()[0].template as<DynamicStruct>().get(\\\"f\\\").template as<uint16_t>())\", _kjCondition, 12345u, lists.get(\"list16\").template as<DynamicList>()[0].template as<DynamicStruct>().get(\"f\").template as<uint16_t>()"
                 ,(char (*) [143])
                  "failed: expected (12345u) == (lists.get(\"list16\").template as<DynamicList>()[0].template as<DynamicStruct>().get(\"f\").template as<uint16_t>())"
                 ,(DebugComparison<unsigned_int,_unsigned_short> *)local_1a78,&local_1bd8,
                 &local_1bda);
      DynamicValue::Builder::~Builder(&local_1c20);
      DynamicValue::Builder::~Builder(&local_1c90);
      DynamicValue::Builder::~Builder(&local_1d08);
      local_1bd1 = false;
    }
  }
  local_1d50 = 0x1a85;
  local_1d4c = kj::_::DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_1d50);
  kj::StringPtr::StringPtr((StringPtr *)&local_1e90,"list16");
  DynamicStruct::Builder::get(&local_1e80,(Builder *)local_38,(StringPtr)local_1e90);
  DynamicValue::Builder::as<capnp::DynamicList>(&local_1e40,&local_1e80);
  DynamicList::Builder::operator[](&local_1e08,&local_1e40,1);
  DynamicValue::Builder::as<capnp::DynamicStruct>(&local_1dc8,&local_1e08);
  kj::StringPtr::StringPtr((StringPtr *)auStack_1ea0,"f");
  DynamicStruct::Builder::get(&local_1d98,&local_1dc8,(StringPtr)_auStack_1ea0);
  local_1d52 = DynamicValue::Builder::as<unsigned_short>(&local_1d98);
  kj::_::DebugExpression<unsigned_int>::operator==
            ((DebugComparison<unsigned_int,_unsigned_short> *)local_1d48,&local_1d4c,&local_1d52);
  DynamicValue::Builder::~Builder(&local_1d98);
  DynamicValue::Builder::~Builder(&local_1e08);
  DynamicValue::Builder::~Builder(&local_1e80);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_1d48);
  if (!bVar1) {
    local_1ea1 = kj::_::Debug::shouldLog(ERROR);
    while (local_1ea1 != false) {
      local_1ea8 = 0x1a85;
      kj::StringPtr::StringPtr((StringPtr *)&local_1fe8,"list16");
      DynamicStruct::Builder::get(&local_1fd8,(Builder *)local_38,(StringPtr)local_1fe8);
      DynamicValue::Builder::as<capnp::DynamicList>(&local_1f98,&local_1fd8);
      DynamicList::Builder::operator[](&local_1f60,&local_1f98,1);
      DynamicValue::Builder::as<capnp::DynamicStruct>(&local_1f20,&local_1f60);
      kj::StringPtr::StringPtr((StringPtr *)&_kjCondition_17.result,"f");
      DynamicStruct::Builder::get(&local_1ef0,&local_1f20,(StringPtr)stack0xffffffffffffe008);
      local_1eaa = DynamicValue::Builder::as<unsigned_short>(&local_1ef0);
      kj::_::Debug::
      log<char_const(&)[142],kj::_::DebugComparison<unsigned_int,unsigned_short>&,unsigned_int,unsigned_short>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x31d,ERROR,
                 "\"failed: expected \" \"(6789u) == (lists.get(\\\"list16\\\").template as<DynamicList>()[1].template as<DynamicStruct>().get(\\\"f\\\").template as<uint16_t>())\", _kjCondition, 6789u, lists.get(\"list16\").template as<DynamicList>()[1].template as<DynamicStruct>().get(\"f\").template as<uint16_t>()"
                 ,(char (*) [142])
                  "failed: expected (6789u) == (lists.get(\"list16\").template as<DynamicList>()[1].template as<DynamicStruct>().get(\"f\").template as<uint16_t>())"
                 ,(DebugComparison<unsigned_int,_unsigned_short> *)local_1d48,&local_1ea8,
                 &local_1eaa);
      DynamicValue::Builder::~Builder(&local_1ef0);
      DynamicValue::Builder::~Builder(&local_1f60);
      DynamicValue::Builder::~Builder(&local_1fd8);
      local_1ea1 = false;
    }
  }
  local_2020 = 0x75bcd15;
  local_201c = kj::_::DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_2020);
  kj::StringPtr::StringPtr((StringPtr *)&local_2160,"list32");
  DynamicStruct::Builder::get(&local_2150,(Builder *)local_38,(StringPtr)local_2160);
  DynamicValue::Builder::as<capnp::DynamicList>(&local_2110,&local_2150);
  DynamicList::Builder::operator[](&local_20d8,&local_2110,0);
  DynamicValue::Builder::as<capnp::DynamicStruct>(&local_2098,&local_20d8);
  kj::StringPtr::StringPtr((StringPtr *)auStack_2170,"f");
  DynamicStruct::Builder::get(&local_2068,&local_2098,(StringPtr)_auStack_2170);
  local_2024 = DynamicValue::Builder::as<unsigned_int>(&local_2068);
  kj::_::DebugExpression<unsigned_int>::operator==
            ((DebugComparison<unsigned_int,_unsigned_int> *)local_2018,&local_201c,&local_2024);
  DynamicValue::Builder::~Builder(&local_2068);
  DynamicValue::Builder::~Builder(&local_20d8);
  DynamicValue::Builder::~Builder(&local_2150);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_2018);
  if (!bVar1) {
    local_2171 = kj::_::Debug::shouldLog(ERROR);
    while (local_2171 != false) {
      local_2178 = 0x75bcd15;
      kj::StringPtr::StringPtr((StringPtr *)&local_22b8,"list32");
      DynamicStruct::Builder::get(&local_22a8,(Builder *)local_38,(StringPtr)local_22b8);
      DynamicValue::Builder::as<capnp::DynamicList>(&local_2268,&local_22a8);
      DynamicList::Builder::operator[](&local_2230,&local_2268,0);
      DynamicValue::Builder::as<capnp::DynamicStruct>(&local_21f0,&local_2230);
      kj::StringPtr::StringPtr((StringPtr *)&_kjCondition_18.result,"f");
      DynamicStruct::Builder::get(&local_21c0,&local_21f0,(StringPtr)stack0xffffffffffffdd38);
      local_217c = DynamicValue::Builder::as<unsigned_int>(&local_21c0);
      kj::_::Debug::
      log<char_const(&)[147],kj::_::DebugComparison<unsigned_int,unsigned_int>&,unsigned_int,unsigned_int>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x31e,ERROR,
                 "\"failed: expected \" \"(123456789u) == (lists.get(\\\"list32\\\").template as<DynamicList>()[0].template as<DynamicStruct>().get(\\\"f\\\").template as<uint32_t>())\", _kjCondition, 123456789u, lists.get(\"list32\").template as<DynamicList>()[0].template as<DynamicStruct>().get(\"f\").template as<uint32_t>()"
                 ,(char (*) [147])
                  "failed: expected (123456789u) == (lists.get(\"list32\").template as<DynamicList>()[0].template as<DynamicStruct>().get(\"f\").template as<uint32_t>())"
                 ,(DebugComparison<unsigned_int,_unsigned_int> *)local_2018,&local_2178,&local_217c)
      ;
      DynamicValue::Builder::~Builder(&local_21c0);
      DynamicValue::Builder::~Builder(&local_2230);
      DynamicValue::Builder::~Builder(&local_22a8);
      local_2171 = false;
    }
  }
  local_22f0 = 0xdfb38d2;
  local_22ec = kj::_::DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_22f0);
  kj::StringPtr::StringPtr((StringPtr *)&local_2430,"list32");
  DynamicStruct::Builder::get(&local_2420,(Builder *)local_38,(StringPtr)local_2430);
  DynamicValue::Builder::as<capnp::DynamicList>(&local_23e0,&local_2420);
  DynamicList::Builder::operator[](&local_23a8,&local_23e0,1);
  DynamicValue::Builder::as<capnp::DynamicStruct>(&local_2368,&local_23a8);
  kj::StringPtr::StringPtr((StringPtr *)auStack_2440,"f");
  DynamicStruct::Builder::get(&local_2338,&local_2368,(StringPtr)_auStack_2440);
  local_22f4 = DynamicValue::Builder::as<unsigned_int>(&local_2338);
  kj::_::DebugExpression<unsigned_int>::operator==
            ((DebugComparison<unsigned_int,_unsigned_int> *)local_22e8,&local_22ec,&local_22f4);
  DynamicValue::Builder::~Builder(&local_2338);
  DynamicValue::Builder::~Builder(&local_23a8);
  DynamicValue::Builder::~Builder(&local_2420);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_22e8);
  if (!bVar1) {
    local_2441 = kj::_::Debug::shouldLog(ERROR);
    while (local_2441 != false) {
      local_2448 = 0xdfb38d2;
      kj::StringPtr::StringPtr((StringPtr *)&local_2588,"list32");
      DynamicStruct::Builder::get(&local_2578,(Builder *)local_38,(StringPtr)local_2588);
      DynamicValue::Builder::as<capnp::DynamicList>(&local_2538,&local_2578);
      DynamicList::Builder::operator[](&local_2500,&local_2538,1);
      DynamicValue::Builder::as<capnp::DynamicStruct>(&local_24c0,&local_2500);
      kj::StringPtr::StringPtr((StringPtr *)&_kjCondition_19.result,"f");
      DynamicStruct::Builder::get(&local_2490,&local_24c0,(StringPtr)stack0xffffffffffffda68);
      local_244c = DynamicValue::Builder::as<unsigned_int>(&local_2490);
      kj::_::Debug::
      log<char_const(&)[147],kj::_::DebugComparison<unsigned_int,unsigned_int>&,unsigned_int,unsigned_int>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                 ,799,ERROR,
                 "\"failed: expected \" \"(234567890u) == (lists.get(\\\"list32\\\").template as<DynamicList>()[1].template as<DynamicStruct>().get(\\\"f\\\").template as<uint32_t>())\", _kjCondition, 234567890u, lists.get(\"list32\").template as<DynamicList>()[1].template as<DynamicStruct>().get(\"f\").template as<uint32_t>()"
                 ,(char (*) [147])
                  "failed: expected (234567890u) == (lists.get(\"list32\").template as<DynamicList>()[1].template as<DynamicStruct>().get(\"f\").template as<uint32_t>())"
                 ,(DebugComparison<unsigned_int,_unsigned_int> *)local_22e8,&local_2448,&local_244c)
      ;
      DynamicValue::Builder::~Builder(&local_2490);
      DynamicValue::Builder::~Builder(&local_2500);
      DynamicValue::Builder::~Builder(&local_2578);
      local_2441 = false;
    }
  }
  local_25d0 = 0x462d53c8abac0;
  local_25c8 = kj::_::DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_25d0);
  kj::StringPtr::StringPtr((StringPtr *)&local_2710,"list64");
  DynamicStruct::Builder::get(&local_2700,(Builder *)local_38,(StringPtr)local_2710);
  DynamicValue::Builder::as<capnp::DynamicList>(&local_26c0,&local_2700);
  DynamicList::Builder::operator[](&local_2688,&local_26c0,0);
  DynamicValue::Builder::as<capnp::DynamicStruct>(&local_2648,&local_2688);
  kj::StringPtr::StringPtr((StringPtr *)auStack_2720,"f");
  DynamicStruct::Builder::get(&local_2618,&local_2648,(StringPtr)_auStack_2720);
  local_25d8 = DynamicValue::Builder::as<unsigned_long>(&local_2618);
  kj::_::DebugExpression<unsigned_long>::operator==
            ((DebugComparison<unsigned_long,_unsigned_long> *)local_25c0,&local_25c8,&local_25d8);
  DynamicValue::Builder::~Builder(&local_2618);
  DynamicValue::Builder::~Builder(&local_2688);
  DynamicValue::Builder::~Builder(&local_2700);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_25c0);
  if (!bVar1) {
    local_2721 = kj::_::Debug::shouldLog(ERROR);
    while (local_2721 != false) {
      local_2730 = 0x462d53c8abac0;
      kj::StringPtr::StringPtr((StringPtr *)&local_2870,"list64");
      DynamicStruct::Builder::get(&local_2860,(Builder *)local_38,(StringPtr)local_2870);
      DynamicValue::Builder::as<capnp::DynamicList>(&local_2820,&local_2860);
      DynamicList::Builder::operator[](&local_27e8,&local_2820,0);
      DynamicValue::Builder::as<capnp::DynamicStruct>(&local_27a8,&local_27e8);
      kj::StringPtr::StringPtr((StringPtr *)&_kjCondition_20.result,"f");
      DynamicStruct::Builder::get(&local_2778,&local_27a8,(StringPtr)stack0xffffffffffffd780);
      local_2738 = DynamicValue::Builder::as<unsigned_long>(&local_2778);
      kj::_::Debug::
      log<char_const(&)[154],kj::_::DebugComparison<unsigned_long,unsigned_long>&,unsigned_long,unsigned_long>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                 ,800,ERROR,
                 "\"failed: expected \" \"(1234567890123456u) == (lists.get(\\\"list64\\\").template as<DynamicList>()[0].template as<DynamicStruct>().get(\\\"f\\\").template as<uint64_t>())\", _kjCondition, 1234567890123456u, lists.get(\"list64\").template as<DynamicList>()[0].template as<DynamicStruct>().get(\"f\").template as<uint64_t>()"
                 ,(char (*) [154])
                  "failed: expected (1234567890123456u) == (lists.get(\"list64\").template as<DynamicList>()[0].template as<DynamicStruct>().get(\"f\").template as<uint64_t>())"
                 ,(DebugComparison<unsigned_long,_unsigned_long> *)local_25c0,&local_2730,
                 &local_2738);
      DynamicValue::Builder::~Builder(&local_2778);
      DynamicValue::Builder::~Builder(&local_27e8);
      DynamicValue::Builder::~Builder(&local_2860);
      local_2721 = false;
    }
  }
  local_28b8 = 0x85561edaa4b87;
  local_28b0 = kj::_::DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_28b8);
  kj::StringPtr::StringPtr((StringPtr *)&local_29f8,"list64");
  DynamicStruct::Builder::get(&local_29e8,(Builder *)local_38,(StringPtr)local_29f8);
  DynamicValue::Builder::as<capnp::DynamicList>(&local_29a8,&local_29e8);
  DynamicList::Builder::operator[](&local_2970,&local_29a8,1);
  DynamicValue::Builder::as<capnp::DynamicStruct>(&local_2930,&local_2970);
  kj::StringPtr::StringPtr((StringPtr *)auStack_2a08,"f");
  DynamicStruct::Builder::get(&local_2900,&local_2930,(StringPtr)_auStack_2a08);
  local_28c0 = DynamicValue::Builder::as<unsigned_long>(&local_2900);
  kj::_::DebugExpression<unsigned_long>::operator==
            ((DebugComparison<unsigned_long,_unsigned_long> *)local_28a8,&local_28b0,&local_28c0);
  DynamicValue::Builder::~Builder(&local_2900);
  DynamicValue::Builder::~Builder(&local_2970);
  DynamicValue::Builder::~Builder(&local_29e8);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_28a8);
  if (!bVar1) {
    local_2a09 = kj::_::Debug::shouldLog(ERROR);
    while (local_2a09 != false) {
      local_2a18 = 0x85561edaa4b87;
      kj::StringPtr::StringPtr((StringPtr *)&local_2b58,"list64");
      DynamicStruct::Builder::get(&local_2b48,(Builder *)local_38,(StringPtr)local_2b58);
      DynamicValue::Builder::as<capnp::DynamicList>(&local_2b08,&local_2b48);
      DynamicList::Builder::operator[](&local_2ad0,&local_2b08,1);
      DynamicValue::Builder::as<capnp::DynamicStruct>(&local_2a90,&local_2ad0);
      kj::StringPtr::StringPtr((StringPtr *)&_kjCondition_21.result,"f");
      DynamicStruct::Builder::get(&local_2a60,&local_2a90,(StringPtr)stack0xffffffffffffd498);
      local_2a20 = DynamicValue::Builder::as<unsigned_long>(&local_2a60);
      kj::_::Debug::
      log<char_const(&)[154],kj::_::DebugComparison<unsigned_long,unsigned_long>&,unsigned_long,unsigned_long>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x321,ERROR,
                 "\"failed: expected \" \"(2345678901234567u) == (lists.get(\\\"list64\\\").template as<DynamicList>()[1].template as<DynamicStruct>().get(\\\"f\\\").template as<uint64_t>())\", _kjCondition, 2345678901234567u, lists.get(\"list64\").template as<DynamicList>()[1].template as<DynamicStruct>().get(\"f\").template as<uint64_t>()"
                 ,(char (*) [154])
                  "failed: expected (2345678901234567u) == (lists.get(\"list64\").template as<DynamicList>()[1].template as<DynamicStruct>().get(\"f\").template as<uint64_t>())"
                 ,(DebugComparison<unsigned_long,_unsigned_long> *)local_28a8,&local_2a18,
                 &local_2a20);
      DynamicValue::Builder::~Builder(&local_2a60);
      DynamicValue::Builder::~Builder(&local_2ad0);
      DynamicValue::Builder::~Builder(&local_2b48);
      local_2a09 = false;
    }
  }
  local_2ba8 = (char (*) [4])
               kj::_::DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(char (*) [4])"foo");
  kj::StringPtr::StringPtr((StringPtr *)&local_2cf8,"listP");
  DynamicStruct::Builder::get(&local_2ce8,(Builder *)local_38,(StringPtr)local_2cf8);
  DynamicValue::Builder::as<capnp::DynamicList>(&local_2ca8,&local_2ce8);
  DynamicList::Builder::operator[](&local_2c70,&local_2ca8,0);
  DynamicValue::Builder::as<capnp::DynamicStruct>(&local_2c30,&local_2c70);
  kj::StringPtr::StringPtr((StringPtr *)auStack_2d08,"f");
  DynamicStruct::Builder::get(&local_2c00,&local_2c30,(StringPtr)_auStack_2d08);
  DynamicValue::Builder::as<capnp::Text>(&local_2bc0,&local_2c00);
  kj::_::DebugExpression<char_const(&)[4]>::operator==
            ((DebugComparison<const_char_(&)[4],_capnp::Text::Builder> *)local_2ba0,
             (DebugExpression<char_const(&)[4]> *)&local_2ba8,&local_2bc0);
  DynamicValue::Builder::~Builder(&local_2c00);
  DynamicValue::Builder::~Builder(&local_2c70);
  DynamicValue::Builder::~Builder(&local_2ce8);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_2ba0);
  if (!bVar1) {
    local_2d09 = kj::_::Debug::shouldLog(ERROR);
    while (local_2d09 != false) {
      kj::StringPtr::StringPtr((StringPtr *)&local_2e60,"listP");
      DynamicStruct::Builder::get(&local_2e50,(Builder *)local_38,(StringPtr)local_2e60);
      DynamicValue::Builder::as<capnp::DynamicList>(&local_2e10,&local_2e50);
      DynamicList::Builder::operator[](&local_2dd8,&local_2e10,0);
      DynamicValue::Builder::as<capnp::DynamicStruct>(&local_2d98,&local_2dd8);
      kj::StringPtr::StringPtr((StringPtr *)&_kjCondition_22.result,"f");
      DynamicStruct::Builder::get(&local_2d68,&local_2d98,(StringPtr)stack0xffffffffffffd190);
      DynamicValue::Builder::as<capnp::Text>(&local_2d28,&local_2d68);
      kj::_::Debug::
      log<char_const(&)[137],kj::_::DebugComparison<char_const(&)[4],capnp::Text::Builder>&,char_const(&)[4],capnp::Text::Builder>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x322,ERROR,
                 "\"failed: expected \" \"(\\\"foo\\\") == (lists.get(\\\"listP\\\").template as<DynamicList>()[0].template as<DynamicStruct>().get(\\\"f\\\").template as<Text>())\", _kjCondition, \"foo\", lists.get(\"listP\").template as<DynamicList>()[0].template as<DynamicStruct>().get(\"f\").template as<Text>()"
                 ,(char (*) [137])
                  "failed: expected (\"foo\") == (lists.get(\"listP\").template as<DynamicList>()[0].template as<DynamicStruct>().get(\"f\").template as<Text>())"
                 ,(DebugComparison<const_char_(&)[4],_capnp::Text::Builder> *)local_2ba0,
                 (char (*) [4])"foo",&local_2d28);
      DynamicValue::Builder::~Builder(&local_2d68);
      DynamicValue::Builder::~Builder(&local_2dd8);
      DynamicValue::Builder::~Builder(&local_2e50);
      local_2d09 = false;
    }
  }
  local_2eb0 = (char (*) [4])
               kj::_::DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(char (*) [4])0x439e6e);
  kj::StringPtr::StringPtr((StringPtr *)&local_3000,"listP");
  DynamicStruct::Builder::get(&local_2ff0,(Builder *)local_38,(StringPtr)local_3000);
  DynamicValue::Builder::as<capnp::DynamicList>(&local_2fb0,&local_2ff0);
  DynamicList::Builder::operator[](&local_2f78,&local_2fb0,1);
  DynamicValue::Builder::as<capnp::DynamicStruct>(&local_2f38,&local_2f78);
  kj::StringPtr::StringPtr((StringPtr *)auStack_3010,"f");
  DynamicStruct::Builder::get(&local_2f08,&local_2f38,(StringPtr)_auStack_3010);
  DynamicValue::Builder::as<capnp::Text>(&local_2ec8,&local_2f08);
  kj::_::DebugExpression<char_const(&)[4]>::operator==
            ((DebugComparison<const_char_(&)[4],_capnp::Text::Builder> *)local_2ea8,
             (DebugExpression<char_const(&)[4]> *)&local_2eb0,&local_2ec8);
  DynamicValue::Builder::~Builder(&local_2f08);
  DynamicValue::Builder::~Builder(&local_2f78);
  DynamicValue::Builder::~Builder(&local_2ff0);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_2ea8);
  if (!bVar1) {
    local_3011 = kj::_::Debug::shouldLog(ERROR);
    while (local_3011 != false) {
      kj::StringPtr::StringPtr((StringPtr *)&local_3168,"listP");
      DynamicStruct::Builder::get(&local_3158,(Builder *)local_38,(StringPtr)local_3168);
      DynamicValue::Builder::as<capnp::DynamicList>(&local_3118,&local_3158);
      DynamicList::Builder::operator[](&local_30e0,&local_3118,1);
      DynamicValue::Builder::as<capnp::DynamicStruct>(&local_30a0,&local_30e0);
      kj::StringPtr::StringPtr((StringPtr *)&l.builder.structDataSize,"f");
      DynamicStruct::Builder::get(&local_3070,&local_30a0,(StringPtr)stack0xffffffffffffce88);
      DynamicValue::Builder::as<capnp::Text>(&local_3030,&local_3070);
      kj::_::Debug::
      log<char_const(&)[137],kj::_::DebugComparison<char_const(&)[4],capnp::Text::Builder>&,char_const(&)[4],capnp::Text::Builder>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x323,ERROR,
                 "\"failed: expected \" \"(\\\"bar\\\") == (lists.get(\\\"listP\\\").template as<DynamicList>()[1].template as<DynamicStruct>().get(\\\"f\\\").template as<Text>())\", _kjCondition, \"bar\", lists.get(\"listP\").template as<DynamicList>()[1].template as<DynamicStruct>().get(\"f\").template as<Text>()"
                 ,(char (*) [137])
                  "failed: expected (\"bar\") == (lists.get(\"listP\").template as<DynamicList>()[1].template as<DynamicStruct>().get(\"f\").template as<Text>())"
                 ,(DebugComparison<const_char_(&)[4],_capnp::Text::Builder> *)local_2ea8,
                 (char (*) [4])0x439e6e,&local_3030);
      DynamicValue::Builder::~Builder(&local_3070);
      DynamicValue::Builder::~Builder(&local_30e0);
      DynamicValue::Builder::~Builder(&local_3158);
      local_3011 = false;
    }
  }
  kj::StringPtr::StringPtr((StringPtr *)&_kjCondition_23.result,"int32ListList");
  name_00.content.size_ = local_31f8;
  name_00.content.ptr = (char *)_kjCondition_23._24_8_;
  DynamicStruct::Builder::get(&local_31f0,(Builder *)local_38,name_00);
  DynamicValue::Builder::as<capnp::DynamicList>
            ((BuilderFor<capnp::DynamicList> *)local_31b0,&local_31f0);
  DynamicValue::Builder::~Builder(&local_31f0);
  local_3228 = 3;
  local_3224 = kj::_::DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_3228);
  f_7.exception._4_4_ = DynamicList::Builder::size((Builder *)local_31b0);
  kj::_::DebugExpression<unsigned_int>::operator==
            ((DebugComparison<unsigned_int,_unsigned_int> *)local_3220,&local_3224,
             (uint *)((long)&f_7.exception + 4));
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_3220);
  if (bVar1) {
    DynamicList::Builder::operator[]((Builder *)(local_329c + 0x1c),(Builder *)local_31b0,0);
    local_329c._0_4_ = VOID;
    local_329c._4_4_ = 2;
    local_329c._8_4_ = 3;
    local_329c._12_8_ = local_329c;
    local_329c._20_8_ = 3;
    expected._M_len = local_31f8;
    expected._M_array = (iterator)0x3;
    checkList<int,capnp::DynamicValue::Builder>
              ((_ *)(local_329c + 0x1c),(Builder *)local_329c._12_8_,expected);
    DynamicValue::Builder::~Builder((Builder *)(local_329c + 0x1c));
    DynamicList::Builder::operator[]((Builder *)(local_32f8 + 0x18),(Builder *)local_31b0,1);
    local_32f8._0_4_ = UINT;
    local_32f8._4_4_ = 5;
    local_32f8._8_8_ = local_32f8;
    local_32f8._16_8_ = 2;
    expected_00._M_len = local_31f8;
    expected_00._M_array = (iterator)0x2;
    checkList<int,capnp::DynamicValue::Builder>
              ((_ *)(local_32f8 + 0x18),(Builder *)local_32f8._8_8_,expected_00);
    DynamicValue::Builder::~Builder((Builder *)(local_32f8 + 0x18));
    DynamicList::Builder::operator[](&local_3338,(Builder *)local_31b0,2);
    l_1.builder.structPointerCount = 0x4ff2;
    l_1.builder.elementSize = 0xbc;
    l_1.builder._39_1_ = 0;
    expected_01._M_len = local_31f8;
    expected_01._M_array = (iterator)0x1;
    checkList<int,capnp::DynamicValue::Builder>
              ((_ *)&local_3338,(Builder *)&l_1.builder.structPointerCount,expected_01);
    DynamicValue::Builder::~Builder(&local_3338);
    kj::StringPtr::StringPtr((StringPtr *)&_kjCondition_24.result,"textListList");
    name.content.size_ = local_33d0;
    name.content.ptr = (char *)_kjCondition_24._24_8_;
    DynamicStruct::Builder::get(&local_33c8,(Builder *)local_38,name);
    DynamicValue::Builder::as<capnp::DynamicList>
              ((BuilderFor<capnp::DynamicList> *)local_3388,&local_33c8);
    DynamicValue::Builder::~Builder(&local_33c8);
    local_3400 = 3;
    local_33fc = kj::_::DebugExpressionStart::operator<<
                           ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_3400);
    f_8.exception._4_4_ = DynamicList::Builder::size((Builder *)local_3388);
    kj::_::DebugExpression<unsigned_int>::operator==
              ((DebugComparison<unsigned_int,_unsigned_int> *)local_33f8,&local_33fc,
               (uint *)((long)&f_8.exception + 4));
    bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_33f8);
    if (!bVar1) {
      local_3414 = 3;
      local_3418 = DynamicList::Builder::size((Builder *)local_3388);
      kj::_::Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_int,unsigned_int>&,unsigned_int,unsigned_int>
                (&local_3410,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x32f,FAILED,"(3u) == (l.size())","_kjCondition,3u, l.size()",
                 (DebugComparison<unsigned_int,_unsigned_int> *)local_33f8,&local_3414,&local_3418);
      kj::_::Debug::Fault::fatal(&local_3410);
    }
    DynamicList::Builder::operator[](&local_3458,(Builder *)local_3388,0);
    Text::Reader::Reader((Reader *)local_3488,"foo");
    Text::Reader::Reader((Reader *)(local_3488 + 0x10),"bar");
    local_3488._32_8_ = local_3488;
    local_3488._40_8_ = (byte *)0x2;
    expected_02._M_len = local_33d0;
    expected_02._M_array = (iterator)0x2;
    checkList<capnp::Text,capnp::DynamicValue::Builder>
              ((_ *)&local_3458,(Builder *)local_3488._32_8_,expected_02);
    DynamicValue::Builder::~Builder(&local_3458);
    DynamicList::Builder::operator[]((Builder *)(local_34e8 + 0x20),(Builder *)local_3388,1);
    Text::Reader::Reader((Reader *)local_34e8,"baz");
    local_34e8._16_8_ = local_34e8;
    local_34e8._24_8_ = 1;
    expected_03._M_len = local_33d0;
    expected_03._M_array = (iterator)0x1;
    checkList<capnp::Text,capnp::DynamicValue::Builder>
              ((_ *)(local_34e8 + 0x20),(Builder *)local_34e8._16_8_,expected_03);
    DynamicValue::Builder::~Builder((Builder *)(local_34e8 + 0x20));
    DynamicList::Builder::operator[](&local_3528,(Builder *)local_3388,2);
    Text::Reader::Reader((Reader *)&l_2.builder.structDataSize,"qux");
    Text::Reader::Reader(&local_3548,"corge");
    local_3538 = &l_2.builder.structDataSize;
    local_3530 = 2;
    expected_04._M_len = local_33d0;
    expected_04._M_array = (iterator)0x2;
    checkList<capnp::Text,capnp::DynamicValue::Builder>
              ((_ *)&local_3528,(Builder *)local_3538,expected_04);
    DynamicValue::Builder::~Builder(&local_3528);
    kj::StringPtr::StringPtr((StringPtr *)&_kjCondition_25.result,"structListList");
    DynamicStruct::Builder::get(&local_35d0,(Builder *)local_38,(StringPtr)stack0xffffffffffffca20);
    DynamicValue::Builder::as<capnp::DynamicList>
              ((BuilderFor<capnp::DynamicList> *)local_3590,&local_35d0);
    DynamicValue::Builder::~Builder(&local_35d0);
    local_3608 = 2;
    local_3604 = kj::_::DebugExpressionStart::operator<<
                           ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_3608);
    f_9.exception._4_4_ = DynamicList::Builder::size((Builder *)local_3590);
    kj::_::DebugExpression<unsigned_int>::operator==
              ((DebugComparison<unsigned_int,_unsigned_int> *)local_3600,&local_3604,
               (uint *)((long)&f_9.exception + 4));
    bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_3600);
    if (!bVar1) {
      e.builder.structPointerCount = 2;
      e.builder.elementSize = VOID;
      e.builder._39_1_ = 0;
      e.builder.structDataSize = DynamicList::Builder::size((Builder *)local_3590);
      kj::_::Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_int,unsigned_int>&,unsigned_int,unsigned_int>
                (&local_3618,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x337,FAILED,"(2u) == (l.size())","_kjCondition,2u, l.size()",
                 (DebugComparison<unsigned_int,_unsigned_int> *)local_3600,
                 (uint *)&e.builder.structPointerCount,&e.builder.structDataSize);
      kj::_::Debug::Fault::fatal(&local_3618);
    }
    DynamicList::Builder::operator[]((Builder *)&_kjCondition_26.result,(Builder *)local_3590,0);
    DynamicValue::Builder::as<capnp::DynamicList>
              ((BuilderFor<capnp::DynamicList> *)local_3658,(Builder *)&_kjCondition_26.result);
    DynamicValue::Builder::~Builder((Builder *)&_kjCondition_26.result);
    local_36c0 = 2;
    local_36bc = kj::_::DebugExpressionStart::operator<<
                           ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_36c0);
    f_10.exception._4_4_ = DynamicList::Builder::size((Builder *)local_3658);
    kj::_::DebugExpression<unsigned_int>::operator==
              ((DebugComparison<unsigned_int,_unsigned_int> *)local_36b8,&local_36bc,
               (uint *)((long)&f_10.exception + 4));
    bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_36b8);
    if (!bVar1) {
      _kjCondition_27._28_4_ = 2;
      _kjCondition_27._24_4_ = DynamicList::Builder::size((Builder *)local_3658);
      kj::_::Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_int,unsigned_int>&,unsigned_int,unsigned_int>
                (&local_36d0,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x339,FAILED,"(2u) == (e.size())","_kjCondition,2u, e.size()",
                 (DebugComparison<unsigned_int,_unsigned_int> *)local_36b8,
                 (uint *)&_kjCondition_27.field_0x1c,(uint *)&_kjCondition_27.result);
      kj::_::Debug::Fault::fatal(&local_36d0);
    }
    local_3700 = 0x7b;
    local_36fc = kj::_::DebugExpressionStart::operator<<
                           ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_3700);
    DynamicList::Builder::operator[]((Builder *)local_3770,(Builder *)local_3658,0);
    DynamicValue::Builder::as<capnproto_test::capnp::test::TestAllTypes>
              (&local_3730,(Builder *)local_3770);
    local_3704 = capnproto_test::capnp::test::TestAllTypes::Builder::getInt32Field(&local_3730);
    kj::_::DebugExpression<int>::operator==
              ((DebugComparison<int,_int> *)local_36f8,&local_36fc,&local_3704);
    DynamicValue::Builder::~Builder((Builder *)local_3770);
    bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_36f8);
    if (!bVar1) {
      local_3771 = kj::_::Debug::shouldLog(ERROR);
      while (local_3771 != false) {
        local_3778 = 0x7b;
        DynamicList::Builder::operator[]((Builder *)&_kjCondition_28.result,(Builder *)local_3658,0)
        ;
        DynamicValue::Builder::as<capnproto_test::capnp::test::TestAllTypes>
                  (&local_37a8,(Builder *)&_kjCondition_28.result);
        local_377c = capnproto_test::capnp::test::TestAllTypes::Builder::getInt32Field(&local_37a8);
        kj::_::Debug::log<char_const(&)[77],kj::_::DebugComparison<int,int>&,int,int>
                  ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                   ,0x33a,ERROR,
                   "\"failed: expected \" \"(123) == (e[0].template as<TestAllTypes>().getInt32Field())\", _kjCondition, 123, e[0].template as<TestAllTypes>().getInt32Field()"
                   ,(char (*) [77])
                    "failed: expected (123) == (e[0].template as<TestAllTypes>().getInt32Field())",
                   (DebugComparison<int,_int> *)local_36f8,&local_3778,&local_377c);
        DynamicValue::Builder::~Builder((Builder *)&_kjCondition_28.result);
        local_3771 = false;
      }
    }
    local_3810 = 0x1c8;
    local_380c = kj::_::DebugExpressionStart::operator<<
                           ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_3810);
    DynamicList::Builder::operator[]((Builder *)local_3880,(Builder *)local_3658,1);
    DynamicValue::Builder::as<capnproto_test::capnp::test::TestAllTypes>
              (&local_3840,(Builder *)local_3880);
    local_3814 = capnproto_test::capnp::test::TestAllTypes::Builder::getInt32Field(&local_3840);
    kj::_::DebugExpression<int>::operator==
              ((DebugComparison<int,_int> *)local_3808,&local_380c,&local_3814);
    DynamicValue::Builder::~Builder((Builder *)local_3880);
    bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_3808);
    if (!bVar1) {
      local_3881 = kj::_::Debug::shouldLog(ERROR);
      while (local_3881 != false) {
        local_3888 = 0x1c8;
        DynamicList::Builder::operator[](&local_38f8,(Builder *)local_3658,1);
        DynamicValue::Builder::as<capnproto_test::capnp::test::TestAllTypes>
                  (&local_38b8,&local_38f8);
        local_388c = capnproto_test::capnp::test::TestAllTypes::Builder::getInt32Field(&local_38b8);
        kj::_::Debug::log<char_const(&)[77],kj::_::DebugComparison<int,int>&,int,int>
                  ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                   ,0x33b,ERROR,
                   "\"failed: expected \" \"(456) == (e[1].template as<TestAllTypes>().getInt32Field())\", _kjCondition, 456, e[1].template as<TestAllTypes>().getInt32Field()"
                   ,(char (*) [77])
                    "failed: expected (456) == (e[1].template as<TestAllTypes>().getInt32Field())",
                   (DebugComparison<int,_int> *)local_3808,&local_3888,&local_388c);
        DynamicValue::Builder::~Builder(&local_38f8);
        local_3881 = false;
      }
    }
    DynamicList::Builder::operator[]((Builder *)&_kjCondition_29.result,(Builder *)local_3590,1);
    DynamicValue::Builder::as<capnp::DynamicList>(&local_3930,(Builder *)&_kjCondition_29.result);
    memcpy(local_3658,&local_3930,0x38);
    DynamicValue::Builder::~Builder((Builder *)&_kjCondition_29.result);
    local_3998 = 1;
    local_3994 = kj::_::DebugExpressionStart::operator<<
                           ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_3998);
    f_11.exception._4_4_ = DynamicList::Builder::size((Builder *)local_3658);
    kj::_::DebugExpression<unsigned_int>::operator==
              ((DebugComparison<unsigned_int,_unsigned_int> *)local_3990,&local_3994,
               (uint *)((long)&f_11.exception + 4));
    bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_3990);
    if (bVar1) {
      local_39d8 = 0x315;
      local_39d4 = kj::_::DebugExpressionStart::operator<<
                             ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_39d8);
      DynamicList::Builder::operator[]((Builder *)local_3a48,(Builder *)local_3658,0);
      DynamicValue::Builder::as<capnproto_test::capnp::test::TestAllTypes>
                (&local_3a08,(Builder *)local_3a48);
      local_39dc = capnproto_test::capnp::test::TestAllTypes::Builder::getInt32Field(&local_3a08);
      kj::_::DebugExpression<int>::operator==
                ((DebugComparison<int,_int> *)local_39d0,&local_39d4,&local_39dc);
      DynamicValue::Builder::~Builder((Builder *)local_3a48);
      bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_39d0);
      if (!bVar1) {
        local_3a49 = kj::_::Debug::shouldLog(ERROR);
        while (local_3a49 != false) {
          local_3a50 = 0x315;
          DynamicList::Builder::operator[](&local_3ac0,(Builder *)local_3658,0);
          DynamicValue::Builder::as<capnproto_test::capnp::test::TestAllTypes>
                    (&local_3a80,&local_3ac0);
          local_3a54 = capnproto_test::capnp::test::TestAllTypes::Builder::getInt32Field
                                 (&local_3a80);
          kj::_::Debug::log<char_const(&)[77],kj::_::DebugComparison<int,int>&,int,int>
                    ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                     ,0x33e,ERROR,
                     "\"failed: expected \" \"(789) == (e[0].template as<TestAllTypes>().getInt32Field())\", _kjCondition, 789, e[0].template as<TestAllTypes>().getInt32Field()"
                     ,(char (*) [77])
                      "failed: expected (789) == (e[0].template as<TestAllTypes>().getInt32Field())"
                     ,(DebugComparison<int,_int> *)local_39d0,&local_3a50,&local_3a54);
          DynamicValue::Builder::~Builder(&local_3ac0);
          local_3a49 = false;
        }
      }
      return;
    }
    _kjCondition_30._28_4_ = 1;
    _kjCondition_30._24_4_ = DynamicList::Builder::size((Builder *)local_3658);
    kj::_::Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_int,unsigned_int>&,unsigned_int,unsigned_int>
              (&local_39a8,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x33d,FAILED,"(1u) == (e.size())","_kjCondition,1u, e.size()",
               (DebugComparison<unsigned_int,_unsigned_int> *)local_3990,
               (uint *)&_kjCondition_30.field_0x1c,(uint *)&_kjCondition_30.result);
    kj::_::Debug::Fault::fatal(&local_39a8);
  }
  local_323c = 3;
  local_3240 = DynamicList::Builder::size((Builder *)local_31b0);
  kj::_::Debug::Fault::
  Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_int,unsigned_int>&,unsigned_int,unsigned_int>
            (&local_3238,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
             ,0x327,FAILED,"(3u) == (l.size())","_kjCondition,3u, l.size()",
             (DebugComparison<unsigned_int,_unsigned_int> *)local_3220,&local_323c,&local_3240);
  kj::_::Debug::Fault::fatal(&local_3238);
}

Assistant:

void dynamicCheckListDefaults(Reader reader) {
  auto lists = reader.get("lists").as<DynamicStruct>();

  ASSERT_EQ(2u, lists.get("list0").as<DynamicList>().size());
  ASSERT_EQ(4u, lists.get("list1").as<DynamicList>().size());
  ASSERT_EQ(2u, lists.get("list8").as<DynamicList>().size());
  ASSERT_EQ(2u, lists.get("list16").as<DynamicList>().size());
  ASSERT_EQ(2u, lists.get("list32").as<DynamicList>().size());
  ASSERT_EQ(2u, lists.get("list64").as<DynamicList>().size());
  ASSERT_EQ(2u, lists.get("listP").as<DynamicList>().size());

  EXPECT_EQ(VOID, lists.get("list0").as<DynamicList>()[0].as<DynamicStruct>().get("f").as<Void>());
  EXPECT_EQ(VOID, lists.get("list0").as<DynamicList>()[1].as<DynamicStruct>().get("f").as<Void>());
  EXPECT_TRUE(lists.get("list1").as<DynamicList>()[0].as<DynamicStruct>().get("f").as<bool>());
  EXPECT_FALSE(lists.get("list1").as<DynamicList>()[1].as<DynamicStruct>().get("f").as<bool>());
  EXPECT_TRUE(lists.get("list1").as<DynamicList>()[2].as<DynamicStruct>().get("f").as<bool>());
  EXPECT_TRUE(lists.get("list1").as<DynamicList>()[3].as<DynamicStruct>().get("f").as<bool>());
  EXPECT_EQ(123u, lists.get("list8").as<DynamicList>()[0].as<DynamicStruct>().get("f").as<uint8_t>());
  EXPECT_EQ(45u, lists.get("list8").as<DynamicList>()[1].as<DynamicStruct>().get("f").as<uint8_t>());
  EXPECT_EQ(12345u, lists.get("list16").as<DynamicList>()[0].as<DynamicStruct>().get("f").as<uint16_t>());
  EXPECT_EQ(6789u, lists.get("list16").as<DynamicList>()[1].as<DynamicStruct>().get("f").as<uint16_t>());
  EXPECT_EQ(123456789u, lists.get("list32").as<DynamicList>()[0].as<DynamicStruct>().get("f").as<uint32_t>());
  EXPECT_EQ(234567890u, lists.get("list32").as<DynamicList>()[1].as<DynamicStruct>().get("f").as<uint32_t>());
  EXPECT_EQ(1234567890123456u, lists.get("list64").as<DynamicList>()[0].as<DynamicStruct>().get("f").as<uint64_t>());
  EXPECT_EQ(2345678901234567u, lists.get("list64").as<DynamicList>()[1].as<DynamicStruct>().get("f").as<uint64_t>());
  EXPECT_EQ("foo", lists.get("listP").as<DynamicList>()[0].as<DynamicStruct>().get("f").as<Text>());
  EXPECT_EQ("bar", lists.get("listP").as<DynamicList>()[1].as<DynamicStruct>().get("f").as<Text>());

  {
    auto l = lists.get("int32ListList").as<DynamicList>();
    ASSERT_EQ(3u, l.size());
    checkList<int32_t>(l[0], {1, 2, 3});
    checkList<int32_t>(l[1], {4, 5});
    checkList<int32_t>(l[2], {12341234});
  }

  {
    auto l = lists.get("textListList").as<DynamicList>();
    ASSERT_EQ(3u, l.size());
    checkList<Text>(l[0], {"foo", "bar"});
    checkList<Text>(l[1], {"baz"});
    checkList<Text>(l[2], {"qux", "corge"});
  }

  {
    auto l = lists.get("structListList").as<DynamicList>();
    ASSERT_EQ(2u, l.size());
    auto e = l[0].as<DynamicList>();
    ASSERT_EQ(2u, e.size());
    EXPECT_EQ(123, e[0].as<TestAllTypes>().getInt32Field());
    EXPECT_EQ(456, e[1].as<TestAllTypes>().getInt32Field());
    e = l[1].as<DynamicList>();
    ASSERT_EQ(1u, e.size());
    EXPECT_EQ(789, e[0].as<TestAllTypes>().getInt32Field());
  }
}